

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atkdp.cpp
# Opt level: O3

void anothersearch(int bomberNum,int bomberID,_func_void_BelongStructure_ptr_float_int_ptr *func)

{
  uint uVar1;
  size_t __n;
  pointer pPVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  float fVar10;
  
  lVar4 = (long)usedGrid[0];
  lVar5 = (long)usedGrid[1];
  lVar7 = (long)usedGrid[2];
  lVar9 = (long)usedGrid[3];
  fVar10 = formularAllShipAtk(shipAtk);
  (*func)(dpRes[lVar4][lVar5][lVar7] + lVar9,fVar10,belonging);
  pPVar2 = planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (bomberNum != 0) {
    iVar8 = 0;
    if (0 < bomberID) {
      uVar1 = bomberID - 1;
      __n = planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
            super__Vector_impl_data._M_start[(uint)bomberID].name._M_string_length;
      iVar8 = 0;
      if ((__n == planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar1].name._M_string_length) &&
         ((__n == 0 ||
          (iVar3 = bcmp(planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                        super__Vector_impl_data._M_start[(uint)bomberID].name._M_dataplus._M_p,
                        planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar1].name._M_dataplus._M_p,__n),
          iVar3 == 0)))) {
        iVar8 = belonging[uVar1];
      }
    }
    if (iVar8 < carrierNum) {
      iVar6 = pPVar2[bomberID].bombAtk * 0xd + pPVar2[bomberID].torpedoAtk * 10;
      iVar3 = pPVar2[bomberID].accuracy;
      lVar4 = (long)iVar8;
      iVar8 = carrierNum;
      do {
        if (usedGrid[lVar4] < availGrid[lVar4]) {
          shipAtk[lVar4] = shipAtk[lVar4] + iVar6;
          shipAccu[lVar4] = shipAccu[lVar4] + iVar3;
          usedGrid[lVar4] = usedGrid[lVar4] + 1;
          belonging[bomberID] = (int)lVar4;
          anothersearch(bomberNum + -1,bomberID + 1,func);
          usedGrid[lVar4] = usedGrid[lVar4] + -1;
          shipAccu[lVar4] = shipAccu[lVar4] - iVar3;
          shipAtk[lVar4] = shipAtk[lVar4] - iVar6;
          iVar8 = carrierNum;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar8);
    }
    return;
  }
  return;
}

Assistant:

void anothersearch(int bomberNum,int bomberID,void(* func)(BelongStructure *,float ,int *)){
    func(&dpRes[usedGrid[0]][usedGrid[1]][usedGrid[2]][usedGrid[3]],formularAllShipAtk(shipAtk),belonging);
    if(bomberNum == 0){//��������
        return;
    }

    int i=0;
    //���������������ظ���
    if(bomberID > 0 && planeVecA[bomberID].name == planeVecA[bomberID - 1].name)
        i = belonging[bomberID - 1];
    Plane &tplane = planeVecA[bomberID];
    int tdamage = formulaDamage(tplane), taccu = tplane.accuracy;
    for(; i < carrierNum; i++){
        if(usedGrid[i]<availGrid[i]){
            shipAtk[i] += tdamage;
            shipAccu[i] += taccu;
            usedGrid[i] ++ ;
            belonging[bomberID] = i;
            anothersearch(bomberNum - 1,bomberID + 1,func);
            usedGrid[i] -- ;
            shipAccu[i] -= taccu;
            shipAtk[i] -= tdamage;
        }
    }
}